

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *
Catch::filterTests(vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__return_storage_ptr__
                  ,vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases,
                  TestSpec *testSpec,IConfig *config)

{
  pointer pTVar1;
  bool bVar2;
  TestCase *testCase;
  pointer testCase_00;
  
  (__return_storage_ptr__->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::reserve
            (__return_storage_ptr__,
             ((long)(testCases->
                    super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0xb8);
  testCase_00 = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                _M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (testCase_00 == pTVar1) {
      return __return_storage_ptr__;
    }
    if ((testSpec->m_filters).
        super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (testSpec->m_filters).
        super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      if (((testCase_00->super_TestCaseInfo).properties & IsHidden) == None) goto LAB_0011dc91;
    }
    else {
      bVar2 = matchTest(testCase_00,testSpec,config);
      if (bVar2) {
LAB_0011dc91:
        clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                  (__return_storage_ptr__,testCase_00);
      }
    }
    testCase_00 = testCase_00 + 1;
  } while( true );
}

Assistant:

std::vector<TestCase> filterTests( std::vector<TestCase> const& testCases, TestSpec const& testSpec, IConfig const& config ) {
        std::vector<TestCase> filtered;
        filtered.reserve( testCases.size() );
        for (auto const& testCase : testCases) {
            if ((!testSpec.hasFilters() && !testCase.isHidden()) ||
                (testSpec.hasFilters() && matchTest(testCase, testSpec, config))) {
                filtered.push_back(testCase);
            }
        }
        return filtered;
    }